

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

void __thiscall
OpenMD::SelectionEvaluator::compareProperty
          (SelectionEvaluator *this,Molecule *mol,SelectionSet *bs,int property,int comparator,
          float comparisonValue)

{
  ulong *puVar1;
  double dVar2;
  RealType RVar3;
  uint i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  Atom *atom;
  pointer ppAVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  Vector3d pos;
  Vector3d local_80;
  Vector3d local_68;
  undefined1 local_48 [16];
  
  local_68.super_Vector<double,_3U>.data_[0] = 0.0;
  local_68.super_Vector<double,_3U>.data_[1] = 0.0;
  local_68.super_Vector<double,_3U>.data_[2] = 0.0;
  switch(property) {
  case 0x1c00:
    RVar3 = Molecule::getMass(mol);
    uVar9 = SUB84(RVar3,0);
    uVar10 = (undefined4)((ulong)RVar3 >> 0x20);
LAB_0021f0ec:
    local_80.super_Vector<double,_3U>.data_[2] = (double)CONCAT44(uVar10,uVar9);
    break;
  case 0x1c01:
    ppAVar7 = (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar7 ==
        (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      atom = (Atom *)0x0;
    }
    else {
      atom = *ppAVar7;
    }
    if (atom == (Atom *)0x0) goto LAB_0021f12f;
    local_80.super_Vector<double,_3U>.data_[2] = 0.0;
    uVar9 = 0;
    uVar10 = 0;
    do {
      ppAVar7 = ppAVar7 + 1;
      local_48._8_4_ = uVar9;
      local_48._0_8_ = local_80.super_Vector<double,_3U>.data_[2];
      local_48._12_4_ = uVar10;
      RVar3 = getCharge(this,atom);
      if (ppAVar7 ==
          (mol->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        atom = (Atom *)0x0;
      }
      else {
        atom = *ppAVar7;
      }
      uVar9 = local_48._8_4_;
      uVar10 = local_48._12_4_;
      local_80.super_Vector<double,_3U>.data_[2] = local_48._0_8_ + RVar3;
    } while (atom != (Atom *)0x0);
    break;
  case 0x1c02:
    Molecule::getCom(&local_80,mol);
    local_80.super_Vector<double,_3U>.data_[2] = local_80.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c03:
    Molecule::getCom(&local_80,mol);
    local_80.super_Vector<double,_3U>.data_[2] = local_80.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c04:
    Molecule::getCom(&local_80,mol);
    break;
  case 0x1c05:
    Molecule::getCom(&local_80,mol);
    local_80.super_Vector<double,_3U>.data_[2] = 0.0;
    lVar4 = 0;
    do {
      dVar2 = local_80.super_Vector<double,_3U>.data_[lVar4];
      local_80.super_Vector<double,_3U>.data_[2] =
           local_80.super_Vector<double,_3U>.data_[2] + dVar2 * dVar2;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    if (local_80.super_Vector<double,_3U>.data_[2] < 0.0) {
      dVar2 = sqrt(local_80.super_Vector<double,_3U>.data_[2]);
      uVar9 = SUB84(dVar2,0);
      uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
      goto LAB_0021f0ec;
    }
    local_80.super_Vector<double,_3U>.data_[2] = SQRT(local_80.super_Vector<double,_3U>.data_[2]);
    break;
  case 0x1c06:
    Molecule::getCom(&local_80,mol);
    local_68.super_Vector<double,_3U>.data_[2] = local_80.super_Vector<double,_3U>.data_[2];
    local_68.super_Vector<double,_3U>.data_[0] = local_80.super_Vector<double,_3U>.data_[0];
    local_68.super_Vector<double,_3U>.data_[1] = local_80.super_Vector<double,_3U>.data_[1];
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    local_80.super_Vector<double,_3U>.data_[2] = local_68.super_Vector<double,_3U>.data_[0];
    break;
  case 0x1c07:
    Molecule::getCom(&local_80,mol);
    local_68.super_Vector<double,_3U>.data_[2] = local_80.super_Vector<double,_3U>.data_[2];
    local_68.super_Vector<double,_3U>.data_[0] = local_80.super_Vector<double,_3U>.data_[0];
    local_68.super_Vector<double,_3U>.data_[1] = local_80.super_Vector<double,_3U>.data_[1];
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    local_80.super_Vector<double,_3U>.data_[2] = local_68.super_Vector<double,_3U>.data_[1];
    break;
  case 0x1c08:
    Molecule::getCom(&local_80,mol);
    local_68.super_Vector<double,_3U>.data_[2] = local_80.super_Vector<double,_3U>.data_[2];
    local_68.super_Vector<double,_3U>.data_[0] = local_80.super_Vector<double,_3U>.data_[0];
    local_68.super_Vector<double,_3U>.data_[1] = local_80.super_Vector<double,_3U>.data_[1];
    Snapshot::wrapVector(this->info->sman_->currentSnapshot_,&local_68);
    local_80.super_Vector<double,_3U>.data_[2] = local_68.super_Vector<double,_3U>.data_[2];
    break;
  default:
    unrecognizedMoleculeProperty(this,property);
LAB_0021f12f:
    local_80.super_Vector<double,_3U>.data_[2] = 0.0;
  }
  switch(comparator) {
  case 0x3400:
    bVar8 = local_80.super_Vector<double,_3U>.data_[2] < (double)comparisonValue;
    break;
  case 0x3401:
    bVar8 = local_80.super_Vector<double,_3U>.data_[2] < (double)comparisonValue;
    goto LAB_0021f1b0;
  case 0x3402:
    dVar2 = (double)comparisonValue;
    goto LAB_0021f18b;
  case 0x3403:
    bVar8 = (double)comparisonValue < local_80.super_Vector<double,_3U>.data_[2];
    break;
  case 0x3404:
    local_80.super_Vector<double,_3U>.data_[2] =
         ABS(local_80.super_Vector<double,_3U>.data_[2] - (double)comparisonValue);
    dVar2 = 1e-06;
LAB_0021f18b:
    bVar8 = dVar2 < local_80.super_Vector<double,_3U>.data_[2];
LAB_0021f1b0:
    bVar8 = !bVar8;
    goto LAB_0021f1cb;
  case 0x3405:
    bVar8 = local_80.super_Vector<double,_3U>.data_[2] != (double)comparisonValue;
    goto LAB_0021f1cb;
  default:
    goto switchD_0021f152_default;
  }
  bVar8 = !bVar8 && (double)comparisonValue != local_80.super_Vector<double,_3U>.data_[2];
LAB_0021f1cb:
  if (bVar8) {
    uVar5 = (ulong)mol->globalIndex_;
    uVar6 = uVar5 + 0x3f;
    if (-1 < (long)uVar5) {
      uVar6 = uVar5;
    }
    puVar1 = (ulong *)(((long)uVar6 >> 6) * 8 +
                       *(long *)&(bs->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                                 super__Bvector_base<std::allocator<bool>_> + -8 +
                      (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)mol->globalIndex_ & 0x3f);
  }
switchD_0021f152_default:
  return;
}

Assistant:

void SelectionEvaluator::compareProperty(Molecule* mol, SelectionSet& bs,
                                           int property, int comparator,
                                           float comparisonValue) {
    RealType propertyValue = 0.0;
    Vector3d pos;

    switch (property) {
    case Token::mass:
      propertyValue = mol->getMass();
      break;
    case Token::charge: {
      Molecule::AtomIterator ai;
      Atom* atom;
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        propertyValue += getCharge(atom);
      }
    } break;
    case Token::x:
      propertyValue = mol->getCom().x();
      break;
    case Token::y:
      propertyValue = mol->getCom().y();
      break;
    case Token::z:
      propertyValue = mol->getCom().z();
      break;
    case Token::wrappedX:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.x();
      break;
    case Token::wrappedY:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.y();
      break;
    case Token::wrappedZ:
      pos = mol->getCom();
      info->getSnapshotManager()->getCurrentSnapshot()->wrapVector(pos);
      propertyValue = pos.z();
      break;
    case Token::r:
      propertyValue = mol->getCom().length();
      break;
    default:
      unrecognizedMoleculeProperty(property);
    }

    bool match = false;
    switch (comparator) {
    case Token::opLT:
      match = propertyValue < comparisonValue;
      break;
    case Token::opLE:
      match = propertyValue <= comparisonValue;
      break;
    case Token::opGE:
      match = propertyValue >= comparisonValue;
      break;
    case Token::opGT:
      match = propertyValue > comparisonValue;
      break;
    case Token::opEQ:
      match = fabs(propertyValue - comparisonValue) <= OpenMD::epsilon;
      break;
    case Token::opNE:
      match = propertyValue != comparisonValue;
      break;
    }

    if (match) bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
  }